

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstracttestlogger.cpp
# Opt level: O0

void __thiscall
QAbstractTestLogger::addMessage
          (QAbstractTestLogger *this,QtMsgType type,QMessageLogContext *context,QString *message)

{
  MessageTypes MVar1;
  QString *in_RDX;
  uint in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  MessageTypes messageType;
  QString formattedMessage;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  anon_class_4_1_89923c38 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MVar1 = addMessage::anon_class_4_1_89923c38::operator()(&local_c);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  qFormatLogMessage((QtMsgType)&local_28,(QMessageLogContext *)(ulong)in_ESI,in_RDX);
  (**(code **)(*in_RDI + 0x58))(in_RDI,MVar1,&local_28,0);
  QString::~QString((QString *)0x11b8fa);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractTestLogger::addMessage(QtMsgType type, const QMessageLogContext &context,
                                     const QString &message)
{
    QAbstractTestLogger::MessageTypes messageType = [=]() {
        switch (type) {
        case QtDebugMsg: return QAbstractTestLogger::QDebug;
        case QtInfoMsg: return QAbstractTestLogger::QInfo;
        case QtCriticalMsg: return QAbstractTestLogger::QCritical;
        case QtWarningMsg: return QAbstractTestLogger::QWarning;
        case QtFatalMsg: return QAbstractTestLogger::QFatal;
        }
        Q_UNREACHABLE_RETURN(QAbstractTestLogger::QFatal);
    }();

    QString formattedMessage = qFormatLogMessage(type, context, message);

    // Note that we explicitly ignore the file and line of the context here,
    // as that's what QTest::messageHandler used to do when calling the same
    // overload directly.
    addMessage(messageType, formattedMessage);
}